

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::operator==(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  int local_24;
  int ind;
  RegularExpression *rxp_local;
  RegularExpression *this_local;
  
  if (this == rxp) {
LAB_00645912:
    this_local._7_1_ = true;
  }
  else {
    local_24 = this->progsize;
    if (this->progsize == rxp->progsize) {
      do {
        iVar1 = local_24 + -1;
        if (local_24 == 0) goto LAB_00645912;
        local_24 = iVar1;
      } while (this->program[iVar1] == rxp->program[iVar1]);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RegularExpression::operator==(const RegularExpression& rxp) const
{
  if (this != &rxp) {         // Same address?
    int ind = this->progsize; // Get regular expression size
    if (ind != rxp.progsize)  // If different size regexp
      return false;           // Return failure
    while (ind-- != 0)        // Else while still characters
      if (this->program[ind] != rxp.program[ind]) // If regexp are different
        return false;                             // Return failure
  }
  return true; // Else same, return success
}